

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveReader.cpp
# Opt level: O0

void __thiscall
CFFPrimitiveReader::SetStream(CFFPrimitiveReader *this,IByteReaderWithPosition *inCFFFile)

{
  int iVar1;
  undefined4 extraout_var;
  IByteReaderWithPosition *inCFFFile_local;
  CFFPrimitiveReader *this_local;
  
  this->mCFFFile = inCFFFile;
  if (inCFFFile == (IByteReaderWithPosition *)0x0) {
    this->mInternalState = eFailure;
  }
  else {
    this->mCurrentOffsize = '\x01';
    iVar1 = (*(inCFFFile->super_IByteReader)._vptr_IByteReader[6])();
    this->mInitialPosition = CONCAT44(extraout_var,iVar1);
    this->mInternalState = eSuccess;
  }
  return;
}

Assistant:

void CFFPrimitiveReader::SetStream(IByteReaderWithPosition* inCFFFile)
{
	mCFFFile = inCFFFile;
	if(inCFFFile)
	{
		mCurrentOffsize = 1;
		mInitialPosition = inCFFFile->GetCurrentPosition();
		mInternalState = PDFHummus::eSuccess;
	}
	else
	{
		mInternalState = PDFHummus::eFailure;
	}
}